

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionRule>::emplace<QTzTransitionRule_const&>
          (QPodArrayOps<QTzTransitionRule> *this,qsizetype i,QTzTransitionRule *args)

{
  QTzTransitionRule **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  int iVar4;
  int iVar5;
  quint8 qVar6;
  undefined3 uVar7;
  QTzTransitionRule *pQVar8;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QTzTransitionRule>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00402dd1:
    qVar6 = args->abbreviationIndex;
    uVar7 = *(undefined3 *)&args->field_0x9;
    iVar4 = args->stdOffset;
    iVar5 = args->dstOffset;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTzTransitionRule>).size != 0)
    ;
    QArrayDataPointer<QTzTransitionRule>::detachAndGrow
              (&this->super_QArrayDataPointer<QTzTransitionRule>,where,1,(QTzTransitionRule **)0x0,
               (QArrayDataPointer<QTzTransitionRule> *)0x0);
    pQVar8 = createHole(this,where,i,1);
    pQVar8->stdOffset = iVar4;
    pQVar8->dstOffset = iVar5;
    pQVar8->abbreviationIndex = qVar6;
    *(undefined3 *)&pQVar8->field_0x9 = uVar7;
  }
  else {
    if (((this->super_QArrayDataPointer<QTzTransitionRule>).size == i) &&
       (pQVar8 = (this->super_QArrayDataPointer<QTzTransitionRule>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar8 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) *
       -0x5555555555555555)) {
      uVar7 = *(undefined3 *)&args->field_0x9;
      pQVar8[i].abbreviationIndex = args->abbreviationIndex;
      *(undefined3 *)&pQVar8[i].field_0x9 = uVar7;
      iVar4 = args->dstOffset;
      pQVar8[i].stdOffset = args->stdOffset;
      pQVar8[i].dstOffset = iVar4;
    }
    else {
      if ((i != 0) ||
         (pQVar8 = (this->super_QArrayDataPointer<QTzTransitionRule>).ptr,
         (QTzTransitionRule *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar8))
      goto LAB_00402dd1;
      uVar7 = *(undefined3 *)&args->field_0x9;
      pQVar8[-1].abbreviationIndex = args->abbreviationIndex;
      *(undefined3 *)&pQVar8[-1].field_0x9 = uVar7;
      iVar4 = args->dstOffset;
      pQVar8[-1].stdOffset = args->stdOffset;
      pQVar8[-1].dstOffset = iVar4;
      ppQVar1 = &(this->super_QArrayDataPointer<QTzTransitionRule>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTzTransitionRule>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }